

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall
OSSLRSA::signInit(OSSLRSA *this,PrivateKey *privateKey,Type mechanism,void *param,size_t paramLen)

{
  PrivateKey *pPVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  CryptoFactory *pCVar5;
  undefined4 extraout_var_09;
  ulong uVar6;
  undefined4 extraout_var_10;
  int *in_RCX;
  Type in_EDX;
  PrivateKey *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  size_t in_R8;
  ByteString dummy_13;
  ByteString dummy_12;
  ByteString dummy_1;
  ByteString dummy_11;
  ByteString dummy_10;
  ByteString dummy_9;
  ByteString dummy_8;
  ByteString dummy_7;
  ByteString dummy_6;
  ByteString dummy_5;
  ByteString dummy_4;
  ByteString dummy_3;
  ByteString dummy_2;
  Type hash2;
  Type hash1;
  ByteString dummy;
  ByteString local_278;
  ByteString local_250;
  ByteString local_228;
  ByteString local_200;
  ByteString local_1d8;
  ByteString local_1b0;
  ByteString local_188;
  ByteString local_160;
  ByteString local_138;
  ByteString local_110;
  ByteString local_e8;
  uint local_6c;
  uint local_68;
  ByteString local_58;
  size_t local_30;
  int *local_28;
  Type local_1c;
  PrivateKey *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  bVar2 = AsymmetricAlgorithm::signInit(in_RDI,in_RSI,in_EDX,in_RCX,in_R8);
  if (bVar2) {
    uVar3 = (*(local_18->super_Serialisable)._vptr_Serialisable[3])
                      (local_18,OSSLRSAPrivateKey::type);
    if ((uVar3 & 1) == 0) {
      softHSMLog(3,"signInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,0x129,"Invalid key type supplied");
      ByteString::ByteString((ByteString *)0x1bd92e);
      AsymmetricAlgorithm::signFinal(in_RDI,&local_58);
      local_1 = 0;
      ByteString::~ByteString((ByteString *)0x1bd95a);
    }
    else {
      local_6c = 0;
      switch(local_1c) {
      case RSA_MD5_PKCS:
        local_68 = 1;
        break;
      default:
        softHSMLog(3,"signInit",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x1b6,"Invalid mechanism supplied (%i)",(ulong)local_1c);
        ByteString::ByteString((ByteString *)0x1be41e);
        AsymmetricAlgorithm::signFinal(in_RDI,&local_228);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1be447);
        goto LAB_001be686;
      case RSA_SHA1_PKCS:
        local_68 = 2;
        break;
      case RSA_SHA224_PKCS:
        local_68 = 3;
        break;
      case RSA_SHA256_PKCS:
        local_68 = 4;
        break;
      case RSA_SHA384_PKCS:
        local_68 = 5;
        break;
      case RSA_SHA512_PKCS:
        local_68 = 6;
        break;
      case RSA_SHA1_PKCS_PSS:
        if (((local_28 == (int *)0x0) || (local_30 != 0x10)) ||
           ((*local_28 != 2 || (local_28[1] != 1)))) {
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x14d,"Invalid parameters");
          ByteString::ByteString((ByteString *)0x1bdaa0);
          AsymmetricAlgorithm::signFinal(in_RDI,(ByteString *)&stack0xffffffffffffff68);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1bdacc);
          goto LAB_001be686;
        }
        in_RDI[1].currentPrivateKey = *(PrivateKey **)(local_28 + 2);
        pPVar1 = in_RDI[1].currentPrivateKey;
        iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        if ((PrivateKey *)((CONCAT44(extraout_var,iVar4) + 6U >> 3) - 0x16) < pPVar1) {
          pPVar1 = in_RDI[1].currentPrivateKey;
          iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x156,"sLen (%lu) is too large for current key size (%lu)",pPVar1,
                     CONCAT44(extraout_var_00,iVar4));
          ByteString::ByteString((ByteString *)0x1bdbbe);
          AsymmetricAlgorithm::signFinal(in_RDI,(ByteString *)&stack0xffffffffffffff40);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1bdbea);
          goto LAB_001be686;
        }
        local_68 = 2;
        break;
      case RSA_SHA224_PKCS_PSS:
        if ((((local_28 == (int *)0x0) || (local_30 != 0x10)) || (*local_28 != 3)) ||
           (local_28[1] != 2)) {
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x162,"Invalid parameters");
          ByteString::ByteString((ByteString *)0x1bdc95);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_e8);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1bdcc1);
          goto LAB_001be686;
        }
        in_RDI[1].currentPrivateKey = *(PrivateKey **)(local_28 + 2);
        pPVar1 = in_RDI[1].currentPrivateKey;
        iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        if ((PrivateKey *)((CONCAT44(extraout_var_01,iVar4) + 6U >> 3) - 0x1e) < pPVar1) {
          pPVar1 = in_RDI[1].currentPrivateKey;
          iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x16b,"sLen (%lu) is too large for current key size (%lu)",pPVar1,
                     CONCAT44(extraout_var_02,iVar4));
          ByteString::ByteString((ByteString *)0x1bddb3);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_110);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1bdddf);
          goto LAB_001be686;
        }
        local_68 = 3;
        break;
      case RSA_SHA256_PKCS_PSS:
        if (((local_28 == (int *)0x0) || (local_30 != 0x10)) ||
           ((*local_28 != 4 || (local_28[1] != 3)))) {
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x177,"Invalid parameters");
          ByteString::ByteString((ByteString *)0x1bde8a);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_138);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1bdeb6);
          goto LAB_001be686;
        }
        in_RDI[1].currentPrivateKey = *(PrivateKey **)(local_28 + 2);
        pPVar1 = in_RDI[1].currentPrivateKey;
        iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        if ((PrivateKey *)((CONCAT44(extraout_var_03,iVar4) + 6U >> 3) - 0x22) < pPVar1) {
          pPVar1 = in_RDI[1].currentPrivateKey;
          iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x180,"sLen (%lu) is too large for current key size (%lu)",pPVar1,
                     CONCAT44(extraout_var_04,iVar4));
          ByteString::ByteString((ByteString *)0x1bdfa2);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_160);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1bdfce);
          goto LAB_001be686;
        }
        local_68 = 4;
        break;
      case RSA_SHA384_PKCS_PSS:
        if (((local_28 == (int *)0x0) || (local_30 != 0x10)) ||
           ((*local_28 != 5 || (local_28[1] != 4)))) {
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x18c,"Invalid parameters");
          ByteString::ByteString((ByteString *)0x1be076);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_188);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1be09f);
          goto LAB_001be686;
        }
        in_RDI[1].currentPrivateKey = *(PrivateKey **)(local_28 + 2);
        pPVar1 = in_RDI[1].currentPrivateKey;
        iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        if ((PrivateKey *)((CONCAT44(extraout_var_05,iVar4) + 6U >> 3) - 0x32) < pPVar1) {
          pPVar1 = in_RDI[1].currentPrivateKey;
          iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x195,"sLen (%lu) is too large for current key size (%lu)",pPVar1,
                     CONCAT44(extraout_var_06,iVar4));
          ByteString::ByteString((ByteString *)0x1be182);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_1b0);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1be1ab);
          goto LAB_001be686;
        }
        local_68 = 5;
        break;
      case RSA_SHA512_PKCS_PSS:
        if ((((local_28 == (int *)0x0) || (local_30 != 0x10)) || (*local_28 != 6)) ||
           (local_28[1] != 5)) {
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x1a1,"Invalid parameters");
          ByteString::ByteString((ByteString *)0x1be253);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_1d8);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1be27c);
          goto LAB_001be686;
        }
        in_RDI[1].currentPrivateKey = *(PrivateKey **)(local_28 + 2);
        pPVar1 = in_RDI[1].currentPrivateKey;
        iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
        if ((PrivateKey *)((CONCAT44(extraout_var_07,iVar4) + 6U >> 3) - 0x42) < pPVar1) {
          pPVar1 = in_RDI[1].currentPrivateKey;
          iVar4 = (*(local_18->super_Serialisable)._vptr_Serialisable[4])();
          softHSMLog(3,"signInit",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                     ,0x1aa,"sLen (%lu) is too large for current key size (%lu)",pPVar1,
                     CONCAT44(extraout_var_08,iVar4));
          ByteString::ByteString((ByteString *)0x1be35f);
          AsymmetricAlgorithm::signFinal(in_RDI,&local_200);
          local_1 = 0;
          ByteString::~ByteString((ByteString *)0x1be388);
          goto LAB_001be686;
        }
        local_68 = 6;
        break;
      case RSA_SSL:
        local_68 = 1;
        local_6c = 2;
      }
      pCVar5 = CryptoFactory::i();
      iVar4 = (*pCVar5->_vptr_CryptoFactory[4])(pCVar5,(ulong)local_68);
      in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)CONCAT44(extraout_var_09,iVar4);
      if ((in_RDI[1]._vptr_AsymmetricAlgorithm == (_func_int **)0x0) ||
         (uVar6 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x10))(), (uVar6 & 1) == 0)) {
        if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
          if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
            (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
          }
          in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
        }
        ByteString::ByteString((ByteString *)0x1be50a);
        AsymmetricAlgorithm::signFinal(in_RDI,&local_250);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1be533);
      }
      else {
        if (local_6c != 0) {
          pCVar5 = CryptoFactory::i();
          iVar4 = (*pCVar5->_vptr_CryptoFactory[4])(pCVar5,(ulong)local_6c);
          in_RDI[1].currentPublicKey = (PublicKey *)CONCAT44(extraout_var_10,iVar4);
          if ((in_RDI[1].currentPublicKey == (PublicKey *)0x0) ||
             (uVar3 = (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[2])(),
             (uVar3 & 1) == 0)) {
            if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
              (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
            }
            in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
            if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
              if (in_RDI[1].currentPublicKey != (PublicKey *)0x0) {
                (*((in_RDI[1].currentPublicKey)->super_Serialisable)._vptr_Serialisable[1])();
              }
              in_RDI[1].currentPublicKey = (PublicKey *)0x0;
            }
            ByteString::ByteString((ByteString *)0x1be62e);
            AsymmetricAlgorithm::signFinal(in_RDI,&local_278);
            local_1 = 0;
            ByteString::~ByteString((ByteString *)0x1be657);
            goto LAB_001be686;
          }
        }
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
LAB_001be686:
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLRSA::signInit(PrivateKey* privateKey, const AsymMech::Type mechanism,
		       const void* param /* = NULL */, const size_t paramLen /* = 0 */)
{
	if (!AsymmetricAlgorithm::signInit(privateKey, mechanism, param, paramLen))
	{
		return false;
	}

	// Check if the private key is the right type
	if (!privateKey->isOfType(OSSLRSAPrivateKey::type))
	{
		ERROR_MSG("Invalid key type supplied");

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	HashAlgo::Type hash1 = HashAlgo::Unknown;
	HashAlgo::Type hash2 = HashAlgo::Unknown;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			hash1 = HashAlgo::MD5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			hash1 = HashAlgo::SHA1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			hash1 = HashAlgo::SHA224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			hash1 = HashAlgo::SHA256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			hash1 = HashAlgo::SHA384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			hash1 = HashAlgo::SHA512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA1 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-20))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA1;
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA224 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-28))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA224;
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA256 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-32))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA256;
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA384 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-48))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA384;
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			if (param == NULL || paramLen != sizeof(RSA_PKCS_PSS_PARAMS) ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->hashAlg != HashAlgo::SHA512 ||
			    ((RSA_PKCS_PSS_PARAMS*) param)->mgf != AsymRSAMGF::MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			sLen = ((RSA_PKCS_PSS_PARAMS*) param)->sLen;
			if (sLen > ((privateKey->getBitLength()+6)/8-2-64))
			{
				ERROR_MSG("sLen (%lu) is too large for current key size (%lu)",
					  (unsigned long)sLen, privateKey->getBitLength());
				ByteString dummy;
				AsymmetricAlgorithm::signFinal(dummy);
				return false;
			}
			hash1 = HashAlgo::SHA512;
			break;
		case AsymMech::RSA_SSL:
			hash1 = HashAlgo::MD5;
			hash2 = HashAlgo::SHA1;
			break;
		default:
			ERROR_MSG("Invalid mechanism supplied (%i)", mechanism);

			ByteString dummy;
			AsymmetricAlgorithm::signFinal(dummy);

			return false;
	}

	pCurrentHash = CryptoFactory::i()->getHashAlgorithm(hash1);

	if (pCurrentHash == NULL || !pCurrentHash->hashInit())
	{
		if (pCurrentHash != NULL)
		{
			delete pCurrentHash;
			pCurrentHash = NULL;
		}

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	if (hash2 != HashAlgo::Unknown)
	{
		pSecondHash = CryptoFactory::i()->getHashAlgorithm(hash2);

		if (pSecondHash == NULL || !pSecondHash->hashInit())
		{
			delete pCurrentHash;
			pCurrentHash = NULL;

			if (pSecondHash != NULL)
			{
				delete pSecondHash;
				pSecondHash = NULL;
			}

			ByteString dummy;
			AsymmetricAlgorithm::signFinal(dummy);

			return false;
		}
	}

	return true;
}